

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventDispatcher.cpp
# Opt level: O2

void __thiscall EventDispatcherHelper::~EventDispatcherHelper(EventDispatcherHelper *this)

{
  Node *pNVar1;
  
  pNVar1 = (this->mEventList).mHead;
  while (pNVar1 = pNVar1->next, pNVar1 != (this->mEventList).mTail) {
    operator_delete(pNVar1->val,0x10);
  }
  JetHead::list<EventDispatcherHelper::EventListenerNode_*>::clear(&this->mEventList);
  JetHead::list<EventDispatcherHelper::EventListenerNode_*>::~list(&this->mEventList);
  Mutex::~Mutex(&this->mLock);
  return;
}

Assistant:

EventDispatcherHelper::~EventDispatcherHelper()
{
	TRACE_BEGIN(LOG_LVL_INFO);

	for (JetHead::list<EventListenerNode*>::iterator i = mEventList.begin();
		 i != mEventList.end(); ++i)
	{
		delete *i;
	}

	mEventList.clear();
}